

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option_inl.hpp
# Opt level: O1

void __thiscall CLI::Option::_reduce_results(Option *this,results_t *out,results_t *original)

{
  byte bVar1;
  type_conflict tVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ArgumentMismatch *pAVar6;
  uint uVar7;
  string *delim;
  pointer pbVar8;
  ulong uVar9;
  int num;
  pointer pbVar10;
  int iVar11;
  pointer pbVar12;
  int t;
  undefined1 local_b0 [32];
  undefined1 local_90 [32];
  string local_70;
  string local_50;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(out);
  switch((this->super_OptionBase<CLI::Option>).multi_option_policy_) {
  case TakeLast:
    local_b0._0_4_ = this->type_size_max_;
    tVar2 = detail::checked_multiply<int>((int *)local_b0,this->expected_max_);
    uVar9 = 1;
    if (1 < (int)local_b0._0_4_) {
      uVar9 = (ulong)(uint)local_b0._0_4_;
    }
    uVar3 = 0x20000000;
    if (tVar2) {
      uVar3 = uVar9;
    }
    pbVar8 = (original->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)pbVar8 -
                (long)(original->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar3) break;
    pbVar10 = pbVar8 + -uVar3;
    goto LAB_00127895;
  case TakeFirst:
    local_b0._0_4_ = this->type_size_max_;
    tVar2 = detail::checked_multiply<int>((int *)local_b0,this->expected_max_);
    uVar9 = 1;
    if (1 < (int)local_b0._0_4_) {
      uVar9 = (ulong)(uint)local_b0._0_4_;
    }
    uVar3 = 0x20000000;
    if (tVar2) {
      uVar3 = uVar9;
    }
    pbVar10 = (original->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(original->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10 >> 5) <= uVar3)
    break;
    pbVar8 = pbVar10 + uVar3;
LAB_00127895:
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_assign_aux<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)out,pbVar10,
               pbVar8);
    break;
  case Join:
    if ((ulong)((long)(this->results_).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->results_).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) < 0x21) break;
    bVar1 = (this->super_OptionBase<CLI::Option>).delimiter_;
    delim = (string *)0xa;
    if (bVar1 != 0) {
      delim = (string *)(ulong)bVar1;
    }
    local_90._0_8_ = (pointer)(local_90 + 0x10);
    ::std::__cxx11::string::_M_construct((ulong)local_90,'\x01');
    detail::join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((string *)local_b0,(detail *)original,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_90,delim);
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)out,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
    if ((undefined1 *)CONCAT44(local_b0._4_4_,local_b0._0_4_) != local_b0 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_b0._4_4_,local_b0._0_4_));
    }
    pbVar10 = (pointer)local_90._0_8_;
    if ((pointer)local_90._0_8_ == (pointer)(local_90 + 0x10)) break;
    goto LAB_00127924;
  case TakeAll:
    break;
  case Sum:
    detail::sum_string_vector((string *)local_b0,original);
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)out,
               (string *)local_b0);
    pbVar10 = (pointer)CONCAT44(local_b0._4_4_,local_b0._0_4_);
    if ((pointer)CONCAT44(local_b0._4_4_,local_b0._0_4_) == (pointer)(local_b0 + 0x10)) break;
LAB_00127924:
    operator_delete(pbVar10);
    break;
  case Reverse:
    local_b0._0_4_ = this->type_size_max_;
    tVar2 = detail::checked_multiply<int>((int *)local_b0,this->expected_max_);
    uVar9 = 1;
    if (1 < (int)local_b0._0_4_) {
      uVar9 = (ulong)(uint)local_b0._0_4_;
    }
    uVar3 = 0x20000000;
    if (tVar2) {
      uVar3 = uVar9;
    }
    pbVar10 = (original->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    uVar4 = (long)pbVar10 -
            (long)(original->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 5;
    uVar9 = uVar4;
    if (uVar3 <= uVar4) {
      uVar9 = uVar3;
    }
    if ((uVar3 < uVar4) || (1 < uVar9)) {
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)out,
                 pbVar10 + -uVar9);
    }
    pbVar10 = (out->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pbVar8 = (out->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pbVar12 = pbVar8 + -1;
    if (pbVar10 < pbVar12 && pbVar10 != pbVar8) {
      do {
        ::std::__cxx11::string::swap((string *)pbVar10);
        pbVar10 = pbVar10 + 1;
        pbVar12 = pbVar12 + -1;
      } while (pbVar10 < pbVar12);
    }
    break;
  default:
    iVar11 = this->expected_min_ * this->type_size_min_;
    local_b0._0_4_ = this->type_size_max_;
    tVar2 = detail::checked_multiply<int>((int *)local_b0,this->expected_max_);
    uVar7 = 0x20000000;
    if (tVar2) {
      uVar7 = local_b0._0_4_;
    }
    iVar11 = iVar11 + (uint)(iVar11 == 0);
    num = uVar7 + (uVar7 == 0);
    pbVar10 = (original->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    lVar5 = (long)(original->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10;
    uVar9 = lVar5 >> 5;
    if (uVar9 < (ulong)(long)iVar11) {
      pAVar6 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
      get_name_abi_cxx11_(&local_50,this,false,false);
      ArgumentMismatch::AtLeast
                (pAVar6,&local_50,iVar11,
                 (long)(original->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(original->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 5);
      __cxa_throw(pAVar6,&ArgumentMismatch::typeinfo,Error::~Error);
    }
    if ((ulong)(long)num < uVar9) {
      if ((((1 < uVar7) || (lVar5 != 0x40)) ||
          (iVar11 = ::std::__cxx11::string::compare((char *)(pbVar10 + 1)), iVar11 != 0)) ||
         (iVar11 = ::std::__cxx11::string::compare
                             ((char *)(original->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start), iVar11 != 0)) {
        pAVar6 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
        get_name_abi_cxx11_(&local_70,this,false,false);
        ArgumentMismatch::AtMost
                  (pAVar6,&local_70,num,
                   (long)(original->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(original->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 5);
        __cxa_throw(pAVar6,&ArgumentMismatch::typeinfo,Error::~Error);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(out,original);
    }
  }
  pbVar10 = (out->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar8 = (out->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar10 == pbVar8) {
    pbVar10 = (original->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((long)(original->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10 != 0x20) {
      return;
    }
    iVar11 = ::std::__cxx11::string::compare((char *)pbVar10);
    if (iVar11 != 0) {
      return;
    }
    if (this->expected_min_ * this->type_size_min_ < 1) {
      return;
    }
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[3]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)out,
               (char (*) [3])"{}");
  }
  else {
    if ((long)pbVar8 - (long)pbVar10 != 0x20) {
      return;
    }
    iVar11 = ::std::__cxx11::string::compare((char *)pbVar10);
    if (iVar11 != 0) {
      return;
    }
    if (this->expected_min_ * this->type_size_min_ < 1) {
      return;
    }
  }
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)out,
             (char (*) [3])"%%");
  return;
}

Assistant:

CLI11_INLINE void Option::_reduce_results(results_t &out, const results_t &original) const {

    // max num items expected or length of vector, always at least 1
    // Only valid for a trimming policy

    out.clear();
    // Operation depends on the policy setting
    switch(multi_option_policy_) {
    case MultiOptionPolicy::TakeAll:
        break;
    case MultiOptionPolicy::TakeLast: {
        // Allow multi-option sizes (including 0)
        std::size_t trim_size = std::min<std::size_t>(
            static_cast<std::size_t>(std::max<int>(get_items_expected_max(), 1)), original.size());
        if(original.size() != trim_size) {
            out.assign(original.end() - static_cast<results_t::difference_type>(trim_size), original.end());
        }
    } break;
    case MultiOptionPolicy::Reverse: {
        // Allow multi-option sizes (including 0)
        std::size_t trim_size = std::min<std::size_t>(
            static_cast<std::size_t>(std::max<int>(get_items_expected_max(), 1)), original.size());
        if(original.size() != trim_size || trim_size > 1) {
            out.assign(original.end() - static_cast<results_t::difference_type>(trim_size), original.end());
        }
        std::reverse(out.begin(), out.end());
    } break;
    case MultiOptionPolicy::TakeFirst: {
        std::size_t trim_size = std::min<std::size_t>(
            static_cast<std::size_t>(std::max<int>(get_items_expected_max(), 1)), original.size());
        if(original.size() != trim_size) {
            out.assign(original.begin(), original.begin() + static_cast<results_t::difference_type>(trim_size));
        }
    } break;
    case MultiOptionPolicy::Join:
        if(results_.size() > 1) {
            out.push_back(detail::join(original, std::string(1, (delimiter_ == '\0') ? '\n' : delimiter_)));
        }
        break;
    case MultiOptionPolicy::Sum:
        out.push_back(detail::sum_string_vector(original));
        break;
    case MultiOptionPolicy::Throw:
    default: {
        auto num_min = static_cast<std::size_t>(get_items_expected_min());
        auto num_max = static_cast<std::size_t>(get_items_expected_max());
        if(num_min == 0) {
            num_min = 1;
        }
        if(num_max == 0) {
            num_max = 1;
        }
        if(original.size() < num_min) {
            throw ArgumentMismatch::AtLeast(get_name(), static_cast<int>(num_min), original.size());
        }
        if(original.size() > num_max) {
            if(original.size() == 2 && num_max == 1 && original[1] == "%%" && original[0] == "{}") {
                // this condition is a trap for the following empty indicator check on config files
                out = original;
            } else {
                throw ArgumentMismatch::AtMost(get_name(), static_cast<int>(num_max), original.size());
            }
        }
        break;
    }
    }
    // this check is to allow an empty vector in certain circumstances but not if expected is not zero.
    // {} is the indicator for an empty container
    if(out.empty()) {
        if(original.size() == 1 && original[0] == "{}" && get_items_expected_min() > 0) {
            out.emplace_back("{}");
            out.emplace_back("%%");
        }
    } else if(out.size() == 1 && out[0] == "{}" && get_items_expected_min() > 0) {
        out.emplace_back("%%");
    }
}